

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall Potassco::AspifInput::matchString(AspifInput *this)

{
  uint uVar1;
  BufferedStream *this_00;
  EVP_PKEY_CTX *dst;
  ProgramReader *in_RDI;
  uint32_t len;
  char *in_stack_ffffffffffffffd8;
  BufferedStream *in_stack_ffffffffffffffe8;
  
  uVar1 = ProgramReader::matchPos(in_RDI,in_stack_ffffffffffffffd8);
  ProgramReader::stream(in_RDI);
  BufferedStream::get(in_stack_ffffffffffffffe8);
  std::__cxx11::string::resize(*(long *)&in_RDI[1].varMax_ + 0x18);
  this_00 = ProgramReader::stream(in_RDI);
  if (uVar1 == 0) {
    dst = (EVP_PKEY_CTX *)0x0;
  }
  else {
    dst = (EVP_PKEY_CTX *)std::__cxx11::string::operator[](*(long *)&in_RDI[1].varMax_ + 0x18);
  }
  BufferedStream::copy(this_00,dst,(EVP_PKEY_CTX *)(ulong)uVar1);
  ProgramReader::require(in_RDI,SUB81((ulong)dst >> 0x38,0),(char *)0x250e37);
  return;
}

Assistant:

void AspifInput::matchString() {
	uint32_t len = matchPos("non-negative string length expected");
	stream()->get();
	data_->sym.resize(len);
	require(stream()->copy(len ? &data_->sym[0] : static_cast<char*>(0), (int)len) == (int)len, "invalid string");
}